

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cGPUShaderFP64Tests.cpp
# Opt level: O1

GLchar * __thiscall
gl4cts::GPUShaderFP64Test10::getUniformName(GPUShaderFP64Test10 *this,GLuint argument)

{
  TestError *this_00;
  
  if (argument < 3) {
    return &DAT_01a89378 + *(int *)(&DAT_01a89378 + (ulong)argument * 4);
  }
  this_00 = (TestError *)__cxa_allocate_exception(0x38);
  tcu::TestError::TestError
            (this_00,"Not implemented",(char *)0x0,
             "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cGPUShaderFP64Tests.cpp"
             ,0x38bc);
  __cxa_throw(this_00,&tcu::TestError::typeinfo,tcu::Exception::~Exception);
}

Assistant:

const glw::GLchar* GPUShaderFP64Test10::getUniformName(glw::GLuint argument) const
{
	switch (argument)
	{
	case 0:
		return "uniform_0";
		break;
	case 1:
		return "uniform_1";
		break;
	case 2:
		return "uniform_2";
		break;
	default:
		TCU_FAIL("Not implemented");
		return 0;
		break;
	}
}